

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O2

void __thiscall Nova::Example<float,_1>::Parse(Example<float,_1> *this,int argc,char **argv)

{
  Parse_Args *this_00;
  ostream *poVar1;
  char **in_RCX;
  string print_args;
  string local_40;
  
  this_00 = (Parse_Args *)operator_new(0x98);
  Parse_Args::Parse_Args(this_00);
  this->parse_args = this_00;
  (*this->_vptr_Example[5])(this);
  Parse_Args::Parse(this->parse_args,argc,argv);
  Parse_Args::Print_Arguments_abi_cxx11_(&local_40,(Parse_Args *)(ulong)(uint)argc,(int)argv,in_RCX)
  ;
  poVar1 = std::operator<<(this->output,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  (*this->_vptr_Example[6])(this);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Example<T,d>::
Parse(int argc,char* argv[])
{
    parse_args=new Parse_Args;
    Register_Options();

    parse_args->Parse(argc,argv);
    std::string print_args=parse_args->Print_Arguments(argc,argv);
    *output<<print_args<<std::endl;

    Parse_Options();
}